

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O3

void __thiscall SCCTest_Loop_Test::TestBody(SCCTest_Loop_Test *this)

{
  char *message;
  initializer_list<unsigned_int> __l;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_00;
  uint local_dc [3];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_d0;
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a0;
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_70;
  undefined1 local_40 [8];
  Graph_conflict1 graph;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  less<unsigned_int> local_14;
  allocator_type local_13;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_12;
  allocator_type local_11;
  
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
            *)local_40,3,(allocator_type *)&local_70);
  Graph::addEdge((Graph *)local_40,0,1);
  Graph::addEdge((Graph *)local_40,1,2);
  Graph::addEdge((Graph *)local_40,2,0);
  getSCCs((SCCSet *)&local_70,(Graph_conflict1 *)local_40);
  local_dc[0] = 0;
  local_dc[1] = 1;
  local_dc[2] = 2;
  __l._M_len = 3;
  __l._M_array = local_dc;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_d0,
             __l,&local_14,&local_13);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_d0;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set((set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
         *)&local_a0,__l_00,&local_12,&local_11);
  testing::internal::
  CmpHelperEQ<std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>,std::set<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::less<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>
            ((internal *)
             &graph.graph.
              super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"getSCCs(graph)",
             "(SCCSet({{0, 1, 2}}))",
             (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_70,
             (set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_a0);
  std::
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_a0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_d0);
  std::
  _Rb_tree<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::_Identity<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_70);
  if ((char)graph.graph.
            super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message((Message *)&local_70);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0xb5,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((long *)local_70._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_impl._0_8_ + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_40);
  return;
}

Assistant:

TEST(SCCTest, Loop) {
  // 0 -> 1 -> 2 -> 0
  // There is only one SCC here.
  Graph graph(3);
  graph.addEdge(0, 1);
  graph.addEdge(1, 2);
  graph.addEdge(2, 0);
  EXPECT_EQ(getSCCs(graph), (SCCSet({{0, 1, 2}})));
}